

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::DoBackgroundParallelMark(Recycler *this)

{
  MarkContext *markContext;
  MarkContext *markContext_00;
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  undefined8 *in_FS_OFFSET;
  MarkContext *local_58;
  MarkContext *splitContexts [2];
  
  markContext = &this->parallelMarkContext2;
  markContext_00 = &this->parallelMarkContext3;
  local_58 = markContext;
  splitContexts[0] = markContext_00;
  if (this->enableParallelMark != true) {
LAB_0028a59b:
    ProcessMark(this,false);
    return;
  }
  uVar6 = this->maxParallelism;
  if (2 < uVar6 - 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xa3d,"(this->maxParallelism > 1 && this->maxParallelism <= 4)",
                       "this->maxParallelism > 1 && this->maxParallelism <= 4");
    if (!bVar3) goto LAB_0028a723;
    *puVar1 = 0;
    uVar6 = this->maxParallelism;
  }
  if (uVar6 < 3) goto LAB_0028a59b;
  splitContexts[1] = &this->markContext;
  uVar5 = MarkContext::Split(splitContexts[1],uVar6 - 2,&local_58);
  if (uVar5 < 3) {
    if (uVar5 == 0) goto LAB_0028a59b;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xa44,"(actualSplitCount <= 2)","actualSplitCount <= 2");
    if (!bVar3) goto LAB_0028a723;
    *puVar1 = 0;
  }
  bVar3 = DoQueueTrackedObject(this);
  if ((!bVar3) && (this->inPartialCollectMode == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xa4f,"(this->DoQueueTrackedObject() || this->inPartialCollectMode)",
                       "this->DoQueueTrackedObject() || this->inPartialCollectMode");
    if (!bVar3) {
LAB_0028a723:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  ObservableValue<Memory::CollectionState>::SetValue
            (&this->collectionState,CollectionStateBackgroundParallelMark);
  bVar3 = RecyclerParallelThread::StartConcurrent(&this->parallelThread1);
  if (uVar5 == 2 && bVar3) {
    bVar4 = RecyclerParallelThread::StartConcurrent(&this->parallelThread2);
  }
  else {
    bVar4 = false;
  }
  ProcessParallelMark(this,false,splitContexts[1]);
  if (bVar3) {
    RecyclerParallelThread::WaitForConcurrent(&this->parallelThread1);
  }
  else {
    ProcessParallelMark(this,false,markContext);
  }
  if (uVar5 == 2) {
    if (bVar4 == false) {
      ProcessParallelMark(this,false,markContext_00);
    }
    else {
      RecyclerParallelThread::WaitForConcurrent(&this->parallelThread2);
    }
  }
  ObservableValue<Memory::CollectionState>::SetValue
            (&this->collectionState,CollectionStateConcurrentMark);
  return;
}

Assistant:

void
Recycler::DoBackgroundParallelMark()
{
    // Split the mark stack into [this->maxParallelism - 1] equal pieces (thus, "- 2" below).
    // The actual # of splits is returned, in case the stack was too small to split that many ways.
    // The parallel threads are hardwired to use parallelMarkContext2/3, so we split using those.
    uint actualSplitCount = 0;
    MarkContext * splitContexts[2] = { &parallelMarkContext2, &parallelMarkContext3 };
    if (this->enableParallelMark)
    {
        Assert(this->maxParallelism > 1 && this->maxParallelism <= 4);
        if (this->maxParallelism > 2)
        {
            actualSplitCount = markContext.Split(this->maxParallelism - 2, splitContexts);
        }
    }

    Assert(actualSplitCount <= 2);

    // If we failed to split at all, just mark in thread with no parallelism.
    if (actualSplitCount == 0)
    {
        this->ProcessMark(true);
        return;
    }

#if ENABLE_PARTIAL_GC
    // We should already be set up to queue tracked objects, unless this is a partial collect
    Assert(this->DoQueueTrackedObject() || this->inPartialCollectMode);
#else
    Assert(this->DoQueueTrackedObject());
#endif

    this->SetCollectionState(CollectionStateBackgroundParallelMark);

    // Kick off marking on parallel threads too, if there is work for them
    // If the threads haven't been created yet, this will create them (or fail).
    bool parallelSuccess1 = false;
    bool parallelSuccess2 = false;
    parallelSuccess1 = parallelThread1.StartConcurrent();
    if (parallelSuccess1 && actualSplitCount == 2)
    {
        parallelSuccess2 = parallelThread2.StartConcurrent();
    }

    // Process our portion of the split.
    this->ProcessParallelMark(true, &markContext);

    // If we successfully launched parallel work, wait for it to complete.
    // If we failed, then process the work in-thread now.
    if (parallelSuccess1)
    {
        parallelThread1.WaitForConcurrent();
    }
    else
    {
        this->ProcessParallelMark(true, &parallelMarkContext2);
    }

    if (actualSplitCount == 2)
    {
        if (parallelSuccess2)
        {
            parallelThread2.WaitForConcurrent();
        }
        else
        {
            this->ProcessParallelMark(true, &parallelMarkContext3);
        }
    }

    this->SetCollectionState(CollectionStateConcurrentMark);
}